

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_archiver_hog.c
# Opt level: O0

int hog2LoadEntries(PHYSFS_Io *io,void *arc)

{
  int iVar1;
  void *pvVar2;
  uint local_64;
  uint local_60;
  PHYSFS_uint32 mtime;
  PHYSFS_uint32 size;
  PHYSFS_uint32 reserved;
  char name [37];
  uint local_28;
  PHYSFS_uint32 i;
  PHYSFS_uint32 pos;
  PHYSFS_uint32 numfiles;
  void *arc_local;
  PHYSFS_Io *io_local;
  
  _pos = arc;
  arc_local = io;
  iVar1 = readui32(io,&i);
  if (iVar1 == 0) {
    io_local._4_4_ = 0;
  }
  else {
    iVar1 = readui32((PHYSFS_Io *)arc_local,&local_28);
    if (iVar1 == 0) {
      io_local._4_4_ = 0;
    }
    else {
      iVar1 = (**(code **)((long)arc_local + 0x20))(arc_local,0x44);
      if (iVar1 == 0) {
        io_local._4_4_ = 0;
      }
      else {
        for (stack0xffffffffffffffd4 = 0; stack0xffffffffffffffd4 < i;
            register0x00000000 = stack0xffffffffffffffd4 + 1) {
          iVar1 = __PHYSFS_readAll((PHYSFS_Io *)arc_local,&size,0x24);
          if (iVar1 == 0) {
            return 0;
          }
          iVar1 = readui32((PHYSFS_Io *)arc_local,&mtime);
          if (iVar1 == 0) {
            return 0;
          }
          iVar1 = readui32((PHYSFS_Io *)arc_local,&local_60);
          if (iVar1 == 0) {
            return 0;
          }
          iVar1 = readui32((PHYSFS_Io *)arc_local,&local_64);
          if (iVar1 == 0) {
            return 0;
          }
          name[0x1c] = '\0';
          pvVar2 = UNPK_addEntry(_pos,(char *)&size,0,(ulong)local_64,(ulong)local_64,
                                 (ulong)local_28,(ulong)local_60);
          if (pvVar2 == (void *)0x0) {
            return 0;
          }
          local_28 = local_60 + local_28;
        }
        io_local._4_4_ = 1;
      }
    }
  }
  return io_local._4_4_;
}

Assistant:

static int hog2LoadEntries(PHYSFS_Io *io, void *arc)
{
    PHYSFS_uint32 numfiles;
    PHYSFS_uint32 pos;
    PHYSFS_uint32 i;

    BAIL_IF_ERRPASS(!readui32(io, &numfiles), 0);
    BAIL_IF_ERRPASS(!readui32(io, &pos), 0);
    BAIL_IF_ERRPASS(!io->seek(io, 68), 0);  /* skip to end of header. */

    for (i = 0; i < numfiles; i++) {
        char name[37];
        PHYSFS_uint32 reserved;
        PHYSFS_uint32 size;
        PHYSFS_uint32 mtime;
        BAIL_IF_ERRPASS(!__PHYSFS_readAll(io, name, 36), 0);
        BAIL_IF_ERRPASS(!readui32(io, &reserved), 0);
        BAIL_IF_ERRPASS(!readui32(io, &size), 0);
        BAIL_IF_ERRPASS(!readui32(io, &mtime), 0);
        name[36] = '\0';  /* just in case */
        BAIL_IF_ERRPASS(!UNPK_addEntry(arc, name, 0, mtime, mtime, pos, size), 0);
        pos += size;
    }

    return 1;
}